

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Vfs_putenv(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_context *pCtx_00;
  int iVar1;
  char *pcVar2;
  int local_54;
  int rc;
  int iLen;
  jx9_vfs *pVfs;
  char *zEnd;
  char *zSettings;
  char *zValue;
  char *zName;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zName = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_bool(pjStack_18,0);
  }
  else {
    zValue = jx9_value_to_string(*(jx9_value **)zName,&local_54);
    zEnd = zValue;
    if (local_54 < 1) {
      jx9_result_bool(pjStack_18,0);
    }
    else {
      pVfs = (jx9_vfs *)(zValue + local_54);
      zSettings = (char *)0x0;
      for (; zEnd < pVfs; zEnd = zEnd + 1) {
        if (*zEnd == '=') {
          *zEnd = '\0';
          zSettings = zEnd + 1;
          break;
        }
      }
      if ((((zSettings == (char *)0x0) || (*zValue == '\0')) || (pVfs <= zSettings)) ||
         (zSettings <= zValue)) {
        jx9_result_bool(pjStack_18,0);
        if (zEnd < pVfs) {
          *zEnd = '=';
        }
      }
      else {
        jx9_vm_config(pjStack_18->pVm,9,zValue,zSettings,(ulong)(uint)((int)pVfs - (int)zSettings));
        _rc = jx9_context_user_data(pjStack_18);
        pCtx_00 = pjStack_18;
        if ((_rc == (void *)0x0) || (*(long *)((long)_rc + 0xf8) == 0)) {
          pcVar2 = jx9_function_name(pjStack_18);
          jx9_context_throw_error_format
                    (pCtx_00,2,
                     "IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE",
                     pcVar2);
          jx9_result_bool(pjStack_18,0);
          *zEnd = '=';
        }
        else {
          iVar1 = (**(code **)((long)_rc + 0xf8))(zValue,zSettings);
          jx9_result_bool(pjStack_18,(uint)(iVar1 == 0));
          *zEnd = '=';
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Vfs_putenv(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zName, *zValue;
	char *zSettings, *zEnd;
	jx9_vfs *pVfs;
	int iLen, rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the setting variable */
	zSettings = (char *)jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Parse the setting */
	zEnd = &zSettings[iLen];
	zValue = 0;
	zName = zSettings;
	while( zSettings < zEnd ){
		if( zSettings[0] == '=' ){
			/* Null terminate the name */
			zSettings[0] = 0;
			zValue = &zSettings[1];
			break;
		}
		zSettings++;
	}
	/* Install the environment variable in the $_Env array */
	if( zValue == 0 || zName[0] == 0 || zValue >= zEnd || zName >= zValue ){
		/* Invalid settings, retun FALSE */
		jx9_result_bool(pCtx, 0);
		if( zSettings  < zEnd ){
			zSettings[0] = '=';
		}
		return JX9_OK;
	}
	jx9_vm_config(pCtx->pVm, JX9_VM_CONFIG_ENV_ATTR, zName, zValue, (int)(zEnd-zValue));
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xSetenv == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		zSettings[0] = '=';
		return JX9_OK;
	}
	/* Perform the requested operation */
	rc = pVfs->xSetenv(zName, zValue);
	jx9_result_bool(pCtx, rc == JX9_OK );
	zSettings[0] = '=';
	return JX9_OK;
}